

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::propagateType
          (UnbasedUnsizedIntegerLiteral *this,ASTContext *param_1,Type *newType)

{
  bool bVar1;
  bitwidth_t bVar2;
  Type *local_30;
  Type *local_28;
  Type *local_20;
  Type *newType_local;
  ASTContext *param_1_local;
  UnbasedUnsizedIntegerLiteral *this_local;
  
  local_20 = newType;
  newType_local = (Type *)param_1;
  param_1_local = (ASTContext *)this;
  bVar1 = Type::isIntegral(newType);
  if (!bVar1) {
    assert::assertFailed
              ("newType.isIntegral()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0x90,
               "bool slang::ast::UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext &, const Type &)"
              );
  }
  bVar2 = Type::getBitWidth(local_20);
  if (bVar2 == 0) {
    assert::assertFailed
              ("newType.getBitWidth()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0x91,
               "bool slang::ast::UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext &, const Type &)"
              );
  }
  local_30 = local_20;
  not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
            ((not_null<slang::ast::Type_const*> *)&local_28,&local_30);
  (this->super_Expression).type.ptr = local_28;
  return true;
}

Assistant:

bool UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext&, const Type& newType) {
    ASSERT(newType.isIntegral());
    ASSERT(newType.getBitWidth());

    type = &newType;
    return true;
}